

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O3

void gflags::anon_unknown_5::Test_MacroArgs_EvaluateOnce::Run(void)

{
  char *pcVar1;
  FlagSettingMode in_R8D;
  char *pcVar2;
  FlagSaver fs;
  string local_28;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","MacroArgs","EvaluateOnce");
  if (fLI::FLAGS_changeable_var == 0xd) {
    if (changeable_var != 0xd) {
      pcVar1 = "test_flag_num1013";
      pcVar2 = "changeable_var";
      goto LAB_00120ca1;
    }
    SetCommandLineOptionWithMode_abi_cxx11_(&local_28,(gflags *)0x14f9a0,"21",(char *)0x1,in_R8D);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p);
    }
    if (fLI::FLAGS_changeable_var == 0x15) {
      FlagSaver::~FlagSaver(&fs);
      return;
    }
    pcVar1 = "test_flag_num1021";
  }
  else {
    pcVar1 = "test_flag_num1013";
  }
  pcVar2 = "FLAGS_changeable_var";
LAB_00120ca1:
  fprintf(_stderr,"Check failed: %s %s %s\n",pcVar1 + 0xf,"==",pcVar2);
  exit(1);
}

Assistant:

TEST(MacroArgs, EvaluateOnce) {
  EXPECT_EQ(13, FLAGS_changeable_var);
  // Make sure we don't ++ the value somehow, when evaluating the flag.
  EXPECT_EQ(13, FLAGS_changeable_var);
  // Make sure the macro only evaluated this var once.
  EXPECT_EQ(13, changeable_var);
  // Make sure the actual value and default value are the same
  SetCommandLineOptionWithMode("changeable_var", "21", SET_FLAG_IF_DEFAULT);
  EXPECT_EQ(21, FLAGS_changeable_var);
}